

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall OpticsParser::Parser::parseAERCID(Parser *this,string *line,ProductData *product)

{
  uint uVar1;
  size_type sVar2;
  string str;
  
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (line,"AERC",0);
  if (sVar2 != 0xffffffffffffffff) {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (line,"ID:",0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&str,line,sVar2 + 3,0xffffffffffffffff);
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&str,'}',0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (&str,sVar2,1);
    uVar1 = std::__cxx11::stoi(&str,(size_t *)0x0,10);
    (product->aercID).super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int> = (_Optional_payload_base<int>)((ulong)uVar1 | 0x100000000);
    std::__cxx11::string::~string((string *)&str);
  }
  return;
}

Assistant:

void Parser::parseAERCID(const std::string & line, ProductData & product)
    {
        if(line.find("AERC") != std::string::npos)
        {
            std::string str = line.substr(line.find("ID:") + 3);
            auto erasePos = str.find('}');
            str.erase(erasePos, 1);
            product.aercID = std::stoi(str);
        }
    }